

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEmbeddedFileDocumentHelper.cc
# Opt level: O0

bool __thiscall
QPDFEmbeddedFileDocumentHelper::removeEmbeddedFile
          (QPDFEmbeddedFileDocumentHelper *this,string *name)

{
  QPDF *this_00;
  bool bVar1;
  __shared_ptr_access<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var2;
  element_type *peVar3;
  pointer pTVar4;
  QPDFObjectHandle *__filename;
  QPDFObjectHandle local_e8;
  QPDFObjGen local_d8;
  undefined1 local_d0 [8];
  QPDFObjectHandle oh;
  iterator local_b0;
  undefined1 local_68 [8];
  iterator iter;
  string *name_local;
  QPDFEmbeddedFileDocumentHelper *this_local;
  
  iter.ivalue.second.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name;
  bVar1 = hasEmbeddedFiles(this);
  if (bVar1) {
    p_Var2 = (__shared_ptr_access<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::
                __shared_ptr_access<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->m);
    peVar3 = std::
             __shared_ptr_access<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var2);
    QPDFNameTreeObjectHelper::find
              ((iterator *)local_68,peVar3,
               (string *)
               iter.ivalue.second.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,false);
    p_Var2 = (__shared_ptr_access<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::
                __shared_ptr_access<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->m);
    peVar3 = std::
             __shared_ptr_access<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var2);
    QPDFNameTreeObjectHelper::end(&local_b0,peVar3);
    bVar1 = QPDFNameTreeObjectHelper::iterator::operator==((iterator *)local_68,&local_b0);
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_b0);
    if (bVar1) {
      this_local._7_1_ = false;
      oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi._0_4_ = 1;
    }
    else {
      pTVar4 = QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_((iterator *)local_68);
      __filename = &pTVar4->second;
      QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_d0,__filename);
      QPDFNameTreeObjectHelper::iterator::remove((iterator *)local_68,(char *)__filename);
      bVar1 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)local_d0);
      if (bVar1) {
        this_00 = (this->super_QPDFDocumentHelper).qpdf;
        local_d8 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)local_d0);
        QPDFObjectHandle::newNull();
        QPDF::replaceObject(this_00,local_d8,&local_e8);
        QPDFObjectHandle::~QPDFObjectHandle(&local_e8);
      }
      this_local._7_1_ = true;
      oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi._0_4_ = 1;
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_d0);
    }
    QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_68);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
QPDFEmbeddedFileDocumentHelper::removeEmbeddedFile(std::string const& name)
{
    if (!hasEmbeddedFiles()) {
        return false;
    }
    auto iter = m->embedded_files->find(name);
    if (iter == m->embedded_files->end()) {
        return false;
    }
    auto oh = iter->second;
    iter.remove();
    if (oh.isIndirect()) {
        this->qpdf.replaceObject(oh.getObjGen(), QPDFObjectHandle::newNull());
    }

    return true;
}